

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

Vec_Int_t * Gia_ManDfsRequireds(Gia_Man_t *p,Vec_Int_t *vObjs,int ReqTime)

{
  Tim_Man_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  bool bVar7;
  float fVar8;
  int local_94;
  int iBox;
  int nTerms;
  int iFirst;
  int nCoLimit;
  int Req;
  int iFan;
  int k;
  int Entry;
  int j;
  Gia_Obj_t *pObj;
  Vec_Int_t *vTimes;
  Tim_Man_t *pManTime;
  int ReqTime_local;
  Vec_Int_t *vObjs_local;
  Gia_Man_t *p_local;
  
  p_00 = (Tim_Man_t *)p->pManTime;
  iVar1 = Gia_ManObjNum(p);
  p_01 = Vec_IntStartFull(iVar1);
  Vec_IntWriteEntry(p_01,0,0);
  if (p_00 == (Tim_Man_t *)0x0) {
    k = 0;
    while( true ) {
      iVar1 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (k < iVar1) {
        _Entry = Gia_ManCo(p,k);
        bVar7 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjFaninId0p(p,_Entry);
      Gia_ManDfsUpdateRequired(p_01,iVar1,ReqTime);
      k = k + 1;
    }
  }
  else {
    iVar1 = Gia_ManCoNum(p);
    iVar2 = Tim_ManPoNum(p_00);
    Tim_ManIncrementTravId(p_00);
    k = 0;
    while( true ) {
      iVar3 = Vec_IntSize(p->vCos);
      bVar7 = false;
      if (k < iVar3) {
        _Entry = Gia_ManCo(p,k);
        bVar7 = _Entry != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      if (iVar1 - iVar2 <= k) {
        Tim_ManSetCoRequired(p_00,k,(float)ReqTime);
        iVar3 = Gia_ObjFaninId0p(p,_Entry);
        Gia_ManDfsUpdateRequired(p_01,iVar3,ReqTime);
      }
      k = k + 1;
    }
  }
  k = Vec_IntSize(vObjs);
  while( true ) {
    while( true ) {
      k = k + -1;
      if (k < 0) {
        return p_01;
      }
      iVar1 = Vec_IntEntry(vObjs,k);
      if (-1 < iVar1) break;
      iVar1 = -1 - iVar1;
      if (iVar1 < 0) {
        __assert_fail("iBox >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x437,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
      }
      iVar2 = Tim_ManBoxOutputFirst(p_00,iVar1);
      iVar3 = Tim_ManBoxOutputNum(p_00,iVar1);
      for (Req = 0; Req < iVar3; Req = Req + 1) {
        pGVar5 = Gia_ManCi(p,iVar2 + Req);
        iVar4 = Gia_ObjId(p,pGVar5);
        local_94 = Vec_IntEntry(p_01,iVar4);
        if (local_94 == -1) {
          local_94 = ReqTime;
        }
        if (local_94 < 0) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x440,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar4 = Gia_ObjCioId(pGVar5);
        Tim_ManSetCiRequired(p_00,iVar4,(float)local_94);
      }
      iVar2 = Tim_ManBoxInputFirst(p_00,iVar1);
      iVar1 = Tim_ManBoxInputNum(p_00,iVar1);
      for (Req = 0; Req < iVar1; Req = Req + 1) {
        pGVar5 = Gia_ManCo(p,iVar2 + Req);
        iVar3 = Gia_ObjCioId(pGVar5);
        fVar8 = Tim_ManGetCoRequired(p_00,iVar3);
        if ((int)fVar8 < 0) {
          __assert_fail("Req >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                        ,0x44a,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
        }
        iVar3 = Gia_ObjFaninId0p(p,pGVar5);
        Gia_ManDfsUpdateRequired(p_01,iVar3,(int)fVar8);
      }
    }
    if (iVar1 < 1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                    ,0x45f,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
    }
    iVar2 = Vec_IntEntry(p_01,iVar1);
    iVar2 = iVar2 + -10;
    if (iVar2 < 0) break;
    iVar3 = Gia_ManHasMapping(p);
    if (iVar3 == 0) {
      pGVar5 = Gia_ManObj(p,iVar1);
      iVar3 = Gia_ObjFaninId0(pGVar5,iVar1);
      Gia_ManDfsUpdateRequired(p_01,iVar3,iVar2);
      iVar1 = Gia_ObjFaninId1(pGVar5,iVar1);
      Gia_ManDfsUpdateRequired(p_01,iVar1,iVar2);
    }
    else {
      iVar3 = Gia_ObjIsLut(p,iVar1);
      if (iVar3 == 0) {
        __assert_fail("Gia_ObjIsLut(p, Entry)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                      ,0x454,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
      }
      for (Req = 0; iVar3 = Gia_ObjLutSize(p,iVar1), Req < iVar3; Req = Req + 1) {
        piVar6 = Gia_ObjLutFanins(p,iVar1);
        Gia_ManDfsUpdateRequired(p_01,piVar6[Req],iVar2);
      }
    }
  }
  __assert_fail("Req >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMan.c"
                ,0x451,"Vec_Int_t *Gia_ManDfsRequireds(Gia_Man_t *, Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_ManDfsRequireds( Gia_Man_t * p, Vec_Int_t * vObjs, int ReqTime )
{
    Tim_Man_t * pManTime = (Tim_Man_t *)p->pManTime;
    Vec_Int_t * vTimes = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; 
    int j, Entry, k, iFan, Req;
    Vec_IntWriteEntry( vTimes, 0, 0 );
    if ( pManTime ) 
    {
        int nCoLimit = Gia_ManCoNum(p) - Tim_ManPoNum(pManTime);
        Tim_ManIncrementTravId( pManTime );
        //Tim_ManInitPoRequiredAll( pManTime, (float)ReqTime );
        Gia_ManForEachCo( p, pObj, j )
            if ( j >= nCoLimit )
            {
                Tim_ManSetCoRequired( pManTime, j, ReqTime );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
            }
    }
    else
    {
        Gia_ManForEachCo( p, pObj, j )
            Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), ReqTime );
    }
    Vec_IntForEachEntryReverse( vObjs, Entry, j )
    {
        if ( Entry < 0 ) // box
        {
            int iFirst, nTerms, iBox = -Entry-1;
            assert( iBox >= 0 );
            // set requireds for box outputs
            iFirst = Tim_ManBoxOutputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxOutputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCi( p, iFirst + k );
                Req  = Vec_IntEntry( vTimes, Gia_ObjId(p, pObj) );
                Req  = Req == -1 ? ReqTime : Req; // dangling box output
                assert( Req >= 0 );
                Tim_ManSetCiRequired( pManTime, Gia_ObjCioId(pObj), Req );
            }
            // derive requireds for box inputs
            iFirst = Tim_ManBoxInputFirst( pManTime, iBox );
            nTerms = Tim_ManBoxInputNum( pManTime, iBox );
            for ( k = 0; k < nTerms; k++ )
            {
                pObj = Gia_ManCo( p, iFirst + k );
                Req  = Tim_ManGetCoRequired( pManTime, Gia_ObjCioId(pObj) );
                assert( Req >= 0 );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0p(p, pObj), Req );
            }
        }
        else if ( Entry > 0 ) // node
        {
            Req = Vec_IntEntry(vTimes, Entry) - 10;
            assert( Req >= 0 );
            if ( Gia_ManHasMapping(p) )
            {
                assert( Gia_ObjIsLut(p, Entry) );
                Gia_LutForEachFanin( p, Entry, iFan, k )
                    Gia_ManDfsUpdateRequired( vTimes, iFan, Req );
            }
            else
            {
                pObj  = Gia_ManObj( p, Entry );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId0(pObj, Entry), Req );
                Gia_ManDfsUpdateRequired( vTimes, Gia_ObjFaninId1(pObj, Entry), Req );
            }
        }
        else assert( 0 );
    }
    return vTimes;
}